

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImpl.cpp
# Opt level: O2

void __thiscall sf::priv::WindowImpl::processJoystickEvents(WindowImpl *this)

{
  queue<sf::Event,_std::deque<sf::Event,_std::allocator<sf::Event>_>_> *this_00;
  float fVar1;
  bool bVar2;
  undefined3 uVar3;
  JoystickManager *pJVar4;
  JoystickState *pJVar5;
  JoystickCaps *pJVar6;
  long lVar7;
  bool *pbVar8;
  uint j_1;
  ulong uVar9;
  JoystickState *pJVar10;
  float (*pafVar11) [8];
  uint j;
  ulong uVar12;
  uint joystick;
  long lVar13;
  byte bVar14;
  Event event;
  float *local_a8;
  JoystickCaps caps;
  JoystickState previousState;
  
  bVar14 = 0;
  pJVar4 = JoystickManager::getInstance();
  JoystickManager::update(pJVar4);
  this_00 = &this->m_events;
  pafVar11 = this->m_previousAxes;
  local_a8 = this->m_joystickStates[0].axes;
  pbVar8 = this->m_joystickStates[0].buttons;
  for (lVar13 = 0; lVar13 != 8; lVar13 = lVar13 + 1) {
    pJVar5 = this->m_joystickStates + lVar13;
    pJVar10 = &previousState;
    for (lVar7 = 0x11; lVar7 != 0; lVar7 = lVar7 + -1) {
      uVar3 = *(undefined3 *)&pJVar5->field_0x1;
      pJVar10->connected = pJVar5->connected;
      *(undefined3 *)&pJVar10->field_0x1 = uVar3;
      pJVar5 = (JoystickState *)((long)pJVar5 + ((ulong)bVar14 * -2 + 1) * 4);
      pJVar10 = (JoystickState *)((long)pJVar10 + (ulong)bVar14 * -8 + 4);
    }
    pJVar4 = JoystickManager::getInstance();
    joystick = (uint)lVar13;
    pJVar5 = JoystickManager::getState(pJVar4,joystick);
    pJVar10 = this->m_joystickStates + lVar13;
    for (lVar7 = 0x11; lVar7 != 0; lVar7 = lVar7 + -1) {
      uVar3 = *(undefined3 *)&pJVar5->field_0x1;
      pJVar10->connected = pJVar5->connected;
      *(undefined3 *)&pJVar10->field_0x1 = uVar3;
      pJVar5 = (JoystickState *)((long)pJVar5 + (ulong)bVar14 * -8 + 4);
      pJVar10 = (JoystickState *)((long)pJVar10 + ((ulong)bVar14 * -2 + 1) * 4);
    }
    bVar2 = this->m_joystickStates[lVar13].connected;
    if (previousState.connected != bVar2) {
      event.type = JoystickDisconnected - bVar2;
      event.field_1.size.width = joystick;
      std::deque<sf::Event,_std::allocator<sf::Event>_>::push_back(&this_00->c,&event);
      if (bVar2 != false) {
        for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 4) {
          *(undefined4 *)((long)*pafVar11 + lVar7) = 0;
        }
      }
    }
    if (bVar2 != false) {
      pJVar4 = JoystickManager::getInstance();
      pJVar6 = JoystickManager::getCapabilities(pJVar4,joystick);
      caps.buttonCount = pJVar6->buttonCount;
      caps.axes[0] = pJVar6->axes[0];
      caps.axes[1] = pJVar6->axes[1];
      caps.axes[2] = pJVar6->axes[2];
      caps.axes[3] = pJVar6->axes[3];
      caps.axes._4_4_ = *(undefined4 *)(pJVar6->axes + 4);
      for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
        if ((caps.axes[lVar7] == true) &&
           (fVar1 = local_a8[lVar7], this->m_joystickThreshold <= ABS(fVar1 - (*pafVar11)[lVar7])))
        {
          event.type = JoystickMoved;
          event.field_1.size.height = (uint)lVar7;
          event.field_1.size.width = joystick;
          event.field_1.joystickMove.position = fVar1;
          std::deque<sf::Event,_std::allocator<sf::Event>_>::push_back(&this_00->c,&event);
          (*pafVar11)[lVar7] = fVar1;
        }
      }
      uVar12 = caps._0_8_ & 0xffffffff;
      for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
        if (previousState.buttons[uVar9] != pbVar8[uVar9]) {
          event.type = pbVar8[uVar9] ^ JoystickButtonReleased;
          event.field_1.size.height = (uint)uVar9;
          event.field_1.size.width = joystick;
          std::deque<sf::Event,_std::allocator<sf::Event>_>::push_back(&this_00->c,&event);
        }
      }
    }
    pafVar11 = pafVar11 + 1;
    local_a8 = local_a8 + 0x11;
    pbVar8 = pbVar8 + 0x44;
  }
  return;
}

Assistant:

void WindowImpl::processJoystickEvents()
{
    // First update the global joystick states
    JoystickManager::getInstance().update();

    for (unsigned int i = 0; i < Joystick::Count; ++i)
    {
        // Copy the previous state of the joystick and get the new one
        JoystickState previousState = m_joystickStates[i];
        m_joystickStates[i] = JoystickManager::getInstance().getState(i);

        // Connection state
        bool connected = m_joystickStates[i].connected;
        if (previousState.connected ^ connected)
        {
            Event event;
            event.type = connected ? Event::JoystickConnected : Event::JoystickDisconnected;
            event.joystickConnect.joystickId = i;
            pushEvent(event);

            // Clear previous axes positions
            if (connected)
                std::fill_n(m_previousAxes[i], static_cast<std::size_t>(Joystick::AxisCount), 0.f);
        }

        if (connected)
        {
            JoystickCaps caps = JoystickManager::getInstance().getCapabilities(i);

            // Axes
            for (unsigned int j = 0; j < Joystick::AxisCount; ++j)
            {
                if (caps.axes[j])
                {
                    Joystick::Axis axis = static_cast<Joystick::Axis>(j);
                    float prevPos = m_previousAxes[i][axis];
                    float currPos = m_joystickStates[i].axes[axis];
                    if (std::abs(currPos - prevPos) >= m_joystickThreshold)
                    {
                        Event event;
                        event.type = Event::JoystickMoved;
                        event.joystickMove.joystickId = i;
                        event.joystickMove.axis = axis;
                        event.joystickMove.position = currPos;
                        pushEvent(event);

                        m_previousAxes[i][axis] = currPos;
                    }
                }
            }

            // Buttons
            for (unsigned int j = 0; j < caps.buttonCount; ++j)
            {
                bool prevPressed = previousState.buttons[j];
                bool currPressed = m_joystickStates[i].buttons[j];

                if (prevPressed ^ currPressed)
                {
                    Event event;
                    event.type = currPressed ? Event::JoystickButtonPressed : Event::JoystickButtonReleased;
                    event.joystickButton.joystickId = i;
                    event.joystickButton.button = j;
                    pushEvent(event);
                }
            }
        }
    }
}